

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

_Bool make_ranged_attack(monster_conflict *mon)

{
  short sVar1;
  wchar_t wVar2;
  undefined1 auVar3 [16];
  monster_conflict *pmVar4;
  _Bool _Var5;
  _Bool _Var6;
  bool bVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  monster_lore *pmVar10;
  undefined7 extraout_var;
  long lVar11;
  loc lVar12;
  loc grid;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  wchar_t tdist;
  bitflag ai_pflags [3];
  bitflag f2 [12];
  bitflag f [12];
  bitflag ai_flags [5];
  char m_name [80];
  int local_e0;
  bitflag local_db [3];
  bitflag local_d8 [12];
  bitflag local_cc [12];
  monster_conflict *local_c0;
  undefined4 local_b8;
  int local_b4;
  bitflag local_ad [5];
  monster_lore *local_a8;
  ulong local_a0;
  element_info local_98 [26];
  long lVar17;
  
  pmVar10 = get_lore(mon->race);
  if (player->timed[2] == 0) {
    _Var5 = monster_is_visible((monster *)mon);
    uVar14 = (undefined4)CONCAT71(extraout_var,_Var5);
  }
  else {
    uVar14 = 0;
  }
  _Var5 = monster_can_cast(mon,false);
  if ((_Var5) || (_Var6 = monster_can_cast(mon,true), _Var6)) {
    local_b8 = uVar14;
    local_a8 = pmVar10;
    flag_copy(local_cc,mon->race->spell_flags,0xc);
    _Var6 = monster_is_smart((monster *)mon);
    if ((_Var6) && ((mon->hp < mon->maxhp / 10 && (uVar8 = Rand_div(2), uVar8 == 0)))) {
      ignore_spells(local_cc,L'\x0f');
    }
    local_c0 = mon;
    _Var6 = monster_is_stupid((monster *)mon);
    pmVar4 = local_c0;
    if (!_Var6) {
      monster_get_target_dist_grid(local_c0,&local_e0,(loc *)0x0);
      flag_copy(local_d8,local_cc,0xc);
      if (pmVar4->maxhp <= pmVar4->hp) {
        flag_off(local_d8,0xc,0x40);
      }
      _Var6 = flag_has_dbg(local_d8,0xc,0x41,"f2","RSF_HEAL_KIN");
      if ((_Var6) && (_Var6 = find_any_nearby_injured_kin((chunk *)cave,pmVar4), !_Var6)) {
        flag_off(local_d8,0xc,0x41);
      }
      if (10 < pmVar4->m_timed[5]) {
        flag_off(local_d8,0xc,0x3f);
      }
      if (local_e0 == 1) {
        flag_off(local_d8,0xc,0x44);
        flag_off(local_d8,0xc,0x45);
      }
      if ((2 < local_e0) && (flag_off(local_d8,0xc,2), 3 < local_e0)) {
        flag_off(local_d8,0xc,3);
      }
      if ((player->opts).opt[0x28] == true) {
        uVar8 = Rand_div(0x14);
        if (uVar8 == 0) {
          flag_wipe((pmVar4->known_pstate).flags,5);
          flag_wipe((pmVar4->known_pstate).pflags,3);
          auVar3 = _DAT_00263600;
          lVar11 = 0;
          auVar16 = _DAT_002668a0;
          auVar18 = _DAT_002635f0;
          do {
            auVar19 = auVar18 ^ auVar3;
            if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7fffffe7) {
              (pmVar4->known_pstate).el_info[lVar11].res_level = 0;
              *(undefined2 *)((long)pmVar4->group_info + lVar11 * 4 + -0x6c) = 0;
            }
            auVar19 = auVar16 ^ auVar3;
            if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7fffffe7) {
              ((element_info *)(pmVar4->group_info + -0xd))[lVar11].res_level = 0;
              *(undefined2 *)((long)pmVar4->group_info + lVar11 * 4 + -100) = 0;
            }
            lVar11 = lVar11 + 4;
            lVar17 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 4;
            auVar18._8_8_ = lVar17 + 4;
            lVar17 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 4;
            auVar16._8_8_ = lVar17 + 4;
          } while (lVar11 != 0x1c);
        }
        flag_wipe(local_ad,5);
        flag_wipe(local_db,3);
        flag_copy(local_ad,(pmVar4->known_pstate).flags,5);
        flag_copy(local_db,(pmVar4->known_pstate).pflags,3);
        _Var6 = flag_is_empty(local_ad,5);
        if ((_Var6) && (_Var6 = flag_is_empty(local_db,3), _Var6)) {
          bVar7 = false;
        }
        else {
          bVar7 = true;
        }
        lVar11 = 0;
        do {
          sVar1 = (pmVar4->known_pstate).el_info[lVar11].res_level;
          local_98[lVar11].res_level = sVar1;
          bVar7 = (bool)(bVar7 | sVar1 != 0);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x19);
        if (bVar7) {
          unset_spells(local_d8,local_ad,local_db,local_98,pmVar4);
        }
      }
      flag_copy(local_cc,local_d8,0xc);
      _Var6 = monster_is_decoyed((monster *)pmVar4);
      if (_Var6) {
        lVar12 = cave_find_decoy(cave);
      }
      else {
        lVar12.x = (player->grid).x;
        lVar12.y = (player->grid).y;
      }
      _Var6 = test_spells(local_cc,L'\x01');
      if ((_Var6) && (_Var6 = projectable((chunk *)cave,pmVar4->grid,lVar12,L'\b'), !_Var6)) {
        ignore_spells(local_cc,L'\x01');
      }
      if (player->upkeep->arena_level == false) {
        lVar12 = local_c0->grid;
        local_a0 = (ulong)(uint)(lVar12.y + L'\x02');
        local_b4 = lVar12.x + L'\xfffffffd';
        iVar15 = local_b4;
        iVar13 = lVar12.y + L'\xfffffffe';
        do {
          do {
            iVar15 = iVar15 + 1;
            grid = (loc)loc(iVar15,iVar13);
            _Var6 = square_in_bounds(cave,grid);
            if ((((_Var6) &&
                 (wVar9 = distance((loc_conflict)lVar12,(loc_conflict)grid), wVar9 < L'\x03')) &&
                (_Var6 = square_iswarded(cave,grid), !_Var6)) &&
               ((_Var6 = square_isempty(cave,grid), _Var6 &&
                (_Var6 = los(cave,(loc_conflict)lVar12,(loc_conflict)grid), _Var6))))
            goto LAB_00164ca5;
          } while (iVar15 < lVar12.x + L'\x02');
          bVar7 = iVar13 < (int)local_a0;
          iVar15 = local_b4;
          iVar13 = iVar13 + 1;
        } while (bVar7);
      }
      ignore_spells(local_cc,L'Ѐ');
    }
LAB_00164ca5:
    _Var6 = flag_is_empty(local_cc,0xc);
    if ((!_Var6) &&
       (wVar9 = choose_attack_spell(local_cc,!_Var5,_Var5), pmVar4 = local_c0, wVar9 != L'\0')) {
      monster_desc((char *)local_98,0x50,(monster *)local_c0,L'̔');
      _Var5 = monster_is_camouflaged((monster *)pmVar4);
      if (_Var5) {
        become_aware((chunk *)cave,pmVar4);
      }
      wVar2 = pmVar4->race->spell_power;
      iVar15 = 0x18;
      if (wVar2 < L'\x02') {
        iVar15 = wVar2 + L'\x06';
        if (-1 < wVar2 + L'\x03') {
          iVar15 = wVar2 + L'\x03';
        }
        iVar15 = 0x19 - (iVar15 >> 2);
      }
      _Var5 = monster_is_stupid((monster *)pmVar4);
      iVar13 = 0;
      if (!_Var5) {
        iVar13 = iVar15 + 0x14;
        if (pmVar4->m_timed[3] == 0) {
          iVar13 = iVar15;
        }
        if ((pmVar4->m_timed[2] != 0) || (pmVar4->m_timed[7] != 0)) {
          iVar13 = iVar13 + 0x32;
        }
      }
      _Var5 = mon_spell_is_innate(wVar9);
      if ((_Var5) || (uVar8 = Rand_div(100), iVar13 <= (int)uVar8)) {
        disturb(player);
        _Var5 = local_b8._0_1_;
        do_mon_spell(wVar9,pmVar4,local_b8._0_1_);
        pmVar10 = local_a8;
        if (_Var5 != false) {
          flag_on_dbg(local_a8->spell_flags,0xc,wVar9,"lore->spell_flags","thrown_spell");
          _Var5 = mon_spell_is_innate(wVar9);
          if (_Var5) {
            if (pmVar10->cast_innate != 0xff) {
              pmVar10->cast_innate = pmVar10->cast_innate + '\x01';
            }
          }
          else if (pmVar10->cast_spell != 0xff) {
            pmVar10->cast_spell = pmVar10->cast_spell + '\x01';
          }
        }
        if ((player->is_dead == true) && (pmVar10->deaths < 0x7fff)) {
          pmVar10->deaths = pmVar10->deaths + 1;
        }
        lore_update(pmVar4->race,pmVar10);
      }
      else {
        msg("%s tries to cast a spell, but fails.",local_98);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool make_ranged_attack(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int thrown_spell, failrate;
	bitflag f[RSF_SIZE];
	char m_name[80];
	bool seen = (player->timed[TMD_BLIND] == 0) && monster_is_visible(mon);
	bool innate = false;

	/* Check for cast this turn, non-innate and then innate */
	if (!monster_can_cast(mon, false)) {
		if (!monster_can_cast(mon, true)) {
			return false;
		} else {
			/* We're casting an innate "spell" */
			innate = true;
		}
	}

	/* Extract the racial spell flags */
	rsf_copy(f, mon->race->spell_flags);

	/* Smart monsters can use "desperate" spells */
	if (monster_is_smart(mon) && mon->hp < mon->maxhp / 10 && one_in_(2)) {
		ignore_spells(f, RST_DAMAGE);
	}

	/* Non-stupid monsters do some filtering */
	if (!monster_is_stupid(mon)) {
		struct loc tgrid;

		/* Remove the "ineffective" spells */
		remove_bad_spells(mon, f);

		/* Check for a clean bolt shot */
		monster_get_target_dist_grid(mon, NULL, &tgrid);
		if (test_spells(f, RST_BOLT) &&
			!projectable(cave, mon->grid, tgrid, PROJECT_STOP)) {
			ignore_spells(f, RST_BOLT);
		}

		/* Check for a possible summon */
		if (!summon_possible(mon->grid)) {
			ignore_spells(f, RST_SUMMON);
		}
	}

	/* No spells left */
	if (rsf_is_empty(f)) return false;

	/* Choose a spell to cast */
	thrown_spell = choose_attack_spell(f, innate, !innate);

	/* Abort if no spell was chosen */
	if (!thrown_spell) return false;

	/* There will be at least an attempt now, so get the monster's name */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* If we see a hidden monster try to cast a spell, become aware of it */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* Check for spell failure (innate attacks never fail) */
	failrate = monster_spell_failrate(mon);
	if (!mon_spell_is_innate(thrown_spell) && (randint0(100) < failrate)) {
		msg("%s tries to cast a spell, but fails.", m_name);
		return true;
	}

	/* Cast the spell. */
	disturb(player);
	do_mon_spell(thrown_spell, mon, seen);

	/* Remember what the monster did */
	if (seen) {
		rsf_on(lore->spell_flags, thrown_spell);
		if (mon_spell_is_innate(thrown_spell)) {
			/* Innate spell */
			if (lore->cast_innate < UCHAR_MAX)
				lore->cast_innate++;
		} else {
			/* Bolt or Ball, or Special spell */
			if (lore->cast_spell < UCHAR_MAX)
				lore->cast_spell++;
		}
	}
	if (player->is_dead && (lore->deaths < SHRT_MAX)) {
		lore->deaths++;
	}
	lore_update(mon->race, lore);

	/* A spell was cast */
	return true;
}